

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall
llvm::raw_ostream::SetBufferAndMode(raw_ostream *this,char *BufferStart,size_t Size,BufferKind Mode)

{
  bool bVar1;
  size_t sVar2;
  BufferKind Mode_local;
  size_t Size_local;
  char *BufferStart_local;
  raw_ostream *this_local;
  
  if ((((Mode == Unbuffered) && (BufferStart == (char *)0x0)) && (Size == 0)) ||
     (((bVar1 = false, Mode != Unbuffered && (bVar1 = false, BufferStart != (char *)0x0)) &&
      (bVar1 = false, Size != 0)))) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("((Mode == Unbuffered && !BufferStart && Size == 0) || (Mode != Unbuffered && BufferStart && Size != 0)) && \"stream must be unbuffered or have at least one byte\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x60,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
  }
  sVar2 = GetNumBytesInBuffer(this);
  if (sVar2 != 0) {
    __assert_fail("GetNumBytesInBuffer() == 0 && \"Current buffer is non-empty!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,99,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
  }
  if ((this->BufferMode == InternalBuffer) && (this->OutBufStart != (char *)0x0)) {
    operator_delete__(this->OutBufStart);
  }
  this->OutBufStart = BufferStart;
  this->OutBufEnd = this->OutBufStart + Size;
  this->OutBufCur = this->OutBufStart;
  this->BufferMode = Mode;
  if (this->OutBufStart <= this->OutBufEnd) {
    return;
  }
  __assert_fail("OutBufStart <= OutBufEnd && \"Invalid size!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x6c,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
}

Assistant:

void raw_ostream::SetBufferAndMode(char *BufferStart, size_t Size,
                                   BufferKind Mode) {
  assert(((Mode == Unbuffered && !BufferStart && Size == 0) ||
          (Mode != Unbuffered && BufferStart && Size != 0)) &&
         "stream must be unbuffered or have at least one byte");
  // Make sure the current buffer is free of content (we can't flush here; the
  // child buffer management logic will be in write_impl).
  assert(GetNumBytesInBuffer() == 0 && "Current buffer is non-empty!");

  if (BufferMode == InternalBuffer)
    delete [] OutBufStart;
  OutBufStart = BufferStart;
  OutBufEnd = OutBufStart+Size;
  OutBufCur = OutBufStart;
  BufferMode = Mode;

  assert(OutBufStart <= OutBufEnd && "Invalid size!");
}